

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

int __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::IdxCompare::operator()(IdxCompare *this,Element *e1,Element *e2)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = EQ(e1->idx,e2->idx);
  iVar1 = 0;
  if (!bVar2) {
    iVar1 = (uint)(e2->idx <= e1->idx) * 2 + -1;
  }
  return iVar1;
}

Assistant:

int operator()(const typename SVectorBase<R>::Element& e1,
                     const typename SVectorBase<R>::Element& e2) const
      {
         if(EQ(e1.idx, e2.idx))
            return 0;

         if(e1.idx < e2.idx)
            return -1;
         else // (e1.idx > e2.idx)
            return 1;
      }